

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-101.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>
::
push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>
           *this,bit_array *x,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,double kappa,
          double delta,double theta,double obj_amp)

{
  int *piVar1;
  undefined1 auVar2 [16];
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  bool bVar3;
  uint uVar4;
  rc_size rVar5;
  row_iterator prVar6;
  rc_data *__first;
  ulong uVar7;
  long lVar8;
  rc_data *__last;
  uint r_size;
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  int k;
  int selected;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  int local_90;
  int local_8c;
  undefined1 local_88 [16];
  rc_size local_78;
  solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>
  *local_70;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_68;
  undefined8 local_60;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  undefined1 extraout_var [56];
  
  fmt._M_str = "push-update-row {} {} {}\n";
  fmt._M_len = 0x19;
  local_50 = obj_amp;
  local_48 = theta;
  local_40 = delta;
  local_38 = kappa;
  debug_logger<true>::log<double,double,double>
            ((debug_logger<true> *)this,fmt,&local_38,&local_40,&local_48);
  if (first._M_current == last._M_current) {
    local_60._0_4_ = 0;
    local_60._4_4_ = 0;
  }
  else {
    local_70 = this + 0x10;
    local_60._0_4_ = 0;
    local_60._4_4_ = 0;
    local_68._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
         (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
          )(tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
            )last._M_current;
    do {
      local_90 = *first._M_current;
      sparse_matrix<int>::row((sparse_matrix<int> *)local_88,(int)local_70);
      if (local_88._8_8_ != local_88._0_8_) {
        lVar8 = *(long *)(this + 0x50);
        prVar6 = (row_iterator)local_88._8_8_;
        do {
          piVar1 = &prVar6->value;
          prVar6 = prVar6 + 1;
          *(double *)(lVar8 + (long)*piVar1 * 8) = local_48 * *(double *)(lVar8 + (long)*piVar1 * 8)
          ;
        } while (prVar6 != (row_iterator)local_88._0_8_);
      }
      rVar5 = solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
              ::compute_reduced_costs<baryonyx::bit_array>
                        ((solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
                          *)this,(row_iterator)local_88._8_8_,(row_iterator)local_88._0_8_,x);
      __first = *(rc_data **)(this + 0x60);
      local_58._M_head_impl = (col_value *)first._M_current;
      if (rVar5.r_size != 0) {
        lVar8 = 0;
        do {
          auVar9._0_8_ = quadratic_cost_type<double>::operator()
                                   (*(quadratic_cost_type<double> **)(this + 0x78),
                                    ((row_iterator)
                                    (local_88._8_8_ + (long)*(int *)((long)&__first->id + lVar8) * 8
                                    ))->column,x);
          auVar9._8_56_ = extraout_var;
          __first = *(rc_data **)(this + 0x60);
          auVar10._8_8_ = 0;
          auVar10._0_8_ = local_50;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *(ulong *)((long)&__first->value + lVar8);
          auVar2 = vfmadd213sd_fma(auVar9._0_16_,auVar10,auVar2);
          *(long *)((long)&__first->value + lVar8) = auVar2._0_8_;
          lVar8 = lVar8 + 0x10;
        } while (((ulong)rVar5 & 0xffffffff) << 4 != lVar8);
      }
      lVar8 = (long)rVar5.r_size;
      if (1 < lVar8) {
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)(this + 8);
        local_78 = rVar5;
        std::
        __introsort_loop<baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data*>(baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data*,baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + lVar8,(int)LZCOUNT(lVar8) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data*>(baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data*,baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + lVar8);
        __last = __first + 1;
        lVar8 = lVar8 * 0x10 + -0x10;
        do {
          if ((__first->value != __last->value) || (NAN(__first->value) || NAN(__last->value))) {
            std::
            shuffle<baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (__first,__last,__g);
            __first = __last;
          }
          __last = __last + 1;
          lVar8 = lVar8 + -0x10;
        } while (lVar8 != 0);
        std::
        shuffle<baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,__last,__g);
        rVar5 = local_78;
      }
      piVar1 = (int *)(*(long *)(this + 0x68) + (long)local_90 * 8);
      uVar4 = rVar5.c_size + *piVar1;
      r_size = rVar5.r_size;
      if ((int)r_size < (int)uVar4) {
        uVar4 = r_size;
      }
      local_8c = uVar4 - 1;
      fmt_00._M_str = "constraints {}: {} = ";
      fmt_00._M_len = 0x15;
      debug_logger<true>::log<int,int>((debug_logger<true> *)this,fmt_00,&local_90,piVar1);
      if (0 < (int)r_size) {
        uVar7 = (ulong)(r_size & 0x7fffffff);
        lVar8 = 0xc;
        do {
          fmt_01._M_str = "{} ({}) ";
          fmt_01._M_len = 8;
          debug_logger<true>::log<double,int>
                    ((debug_logger<true> *)this,fmt_01,
                     (double *)(*(long *)(this + 0x60) + -0xc + lVar8),
                     (int *)(*(long *)(this + 0x60) + lVar8));
          lVar8 = lVar8 + 0x10;
          uVar7 = uVar7 - 1;
        } while (uVar7 != 0);
      }
      fmt_02._M_str = " => Selected: {}\n";
      fmt_02._M_len = 0x11;
      debug_logger<true>::log<int>((debug_logger<true> *)this,fmt_02,&local_8c);
      bVar3 = affect<baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,double>
                        ((solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
                          *)this,x,(row_value *)local_88._8_8_,local_90,local_8c,r_size,local_38,
                         local_40);
      local_60._0_1_ = (byte)local_60 | bVar3;
      first._M_current = &(local_58._M_head_impl)->row;
    } while ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
              )first._M_current !=
             (_Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
              )local_68._M_t.
               super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
               .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl
            );
  }
  return (bool)((byte)local_60 & 1);
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float obj_amp)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto sizes =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != sizes.r_size; ++i)
                R[i].value +=
                  obj_amp * c((std::get<0>(it) + R[i].id)->column, x);

            calculator_sort<Mode>(R.get(), R.get() + sizes.r_size, rng);
            int selected = select_variables(sizes, b[k].value);

            logger::log("constraints {}: {} = ", k, b[k].value);

            for (int i = 0; i < sizes.r_size; ++i)
                logger::log("{} ({}) ", R[i].value, R[i].id);

            logger::log(" => Selected: {}\n", selected);

            auto pi_change = affect(*this,
                                    x,
                                    std::get<0>(it),
                                    k,
                                    selected,
                                    sizes.r_size,
                                    kappa,
                                    delta);
            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }